

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_compareEquivalentUnitsWhichHaveNonStandardBase_Test::
~Units_compareEquivalentUnitsWhichHaveNonStandardBase_Test
          (Units_compareEquivalentUnitsWhichHaveNonStandardBase_Test *this)

{
  Units_compareEquivalentUnitsWhichHaveNonStandardBase_Test *this_local;
  
  ~Units_compareEquivalentUnitsWhichHaveNonStandardBase_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, compareEquivalentUnitsWhichHaveNonStandardBase)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("model");

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit("u");

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit("u");

    model->addUnits(u);
    model->addUnits(u1);
    model->addUnits(u2);

    EXPECT_TRUE(libcellml::Units::equivalent(u1, u2));
    EXPECT_TRUE(libcellml::Units::equivalent(u2, u1));
}